

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O2

void VP8LDoFillBitWindow(VP8LBitReader *br)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  sVar1 = br->pos_;
  if (sVar1 + 8 < br->len_) {
    uVar2 = br->val_;
    br->val_ = uVar2 >> 0x20;
    br->bit_pos_ = br->bit_pos_ + -0x20;
    br->val_ = (ulong)*(uint *)(br->buf_ + sVar1) << 0x20 | uVar2 >> 0x20;
    br->pos_ = sVar1 + 4;
    return;
  }
  iVar4 = br->bit_pos_;
  while ((7 < iVar4 && (uVar2 = br->pos_, uVar2 < br->len_))) {
    uVar3 = br->val_;
    br->val_ = uVar3 >> 8;
    br->val_ = (ulong)br->buf_[uVar2] << 0x38 | uVar3 >> 8;
    br->pos_ = uVar2 + 1;
    iVar4 = iVar4 + -8;
    br->bit_pos_ = iVar4;
  }
  iVar4 = VP8LIsEndOfStream(br);
  if (iVar4 != 0) {
    br->bit_pos_ = 0;
    br->eos_ = 1;
  }
  return;
}

Assistant:

void VP8LDoFillBitWindow(VP8LBitReader* const br) {
  assert(br->bit_pos_ >= VP8L_WBITS);
#if defined(VP8L_USE_FAST_LOAD)
  if (br->pos_ + sizeof(br->val_) < br->len_) {
    br->val_ >>= VP8L_WBITS;
    br->bit_pos_ -= VP8L_WBITS;
    br->val_ |= (vp8l_val_t)HToLE32(WebPMemToUint32(br->buf_ + br->pos_)) <<
                (VP8L_LBITS - VP8L_WBITS);
    br->pos_ += VP8L_LOG8_WBITS;
    return;
  }
#endif
  ShiftBytes(br);       // Slow path.
}